

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvode.c
# Opt level: O2

int cvRcheck3(CVodeMem cv_mem)

{
  int *piVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  long lVar7;
  int iVar8;
  ulong uVar9;
  ulong uVar10;
  bool bVar11;
  double dVar12;
  double dVar13;
  sunrealtype sVar14;
  double dVar15;
  double dVar16;
  sunrealtype t;
  double dVar17;
  
  iVar4 = cv_mem->cv_taskc;
  if (iVar4 == 2) {
    cv_mem->cv_thi = cv_mem->cv_tn;
    N_VScale(0x3ff0000000000000,cv_mem->cv_zn[0]);
    iVar4 = cv_mem->cv_taskc;
  }
  if (iVar4 == 1) {
    dVar12 = cv_mem->cv_toutc;
    if (0.0 <= (dVar12 - cv_mem->cv_tn) * cv_mem->cv_h) {
      cv_mem->cv_thi = cv_mem->cv_tn;
      N_VScale(0x3ff0000000000000,cv_mem->cv_zn[0],cv_mem->cv_y);
    }
    else {
      cv_mem->cv_thi = dVar12;
      CVodeGetDky(cv_mem,dVar12,0,cv_mem->cv_y);
    }
  }
  iVar3 = (*cv_mem->cv_gfun)(cv_mem->cv_thi,cv_mem->cv_y,cv_mem->cv_ghi,cv_mem->cv_user_data);
  cv_mem->cv_nge = cv_mem->cv_nge + 1;
  iVar4 = -0xc;
  if (iVar3 == 0) {
    dVar12 = (ABS(cv_mem->cv_h) + ABS(cv_mem->cv_tn)) * cv_mem->cv_uround * 100.0;
    cv_mem->cv_ttol = dVar12;
    uVar5 = cv_mem->cv_nrtfn;
    uVar9 = 0;
    uVar6 = 0;
    if (0 < (int)uVar5) {
      uVar6 = (ulong)uVar5;
    }
    dVar13 = 0.0;
    uVar10 = 0;
    bVar2 = false;
    bVar11 = false;
    for (; uVar6 != uVar9; uVar9 = uVar9 + 1) {
      if (cv_mem->cv_gactive[uVar9] != 0) {
        dVar15 = cv_mem->cv_ghi[uVar9];
        if ((dVar15 != 0.0) || (NAN(dVar15))) {
          dVar17 = cv_mem->cv_glo[uVar9];
          if ((((0.0 < dVar15) && (dVar17 < 0.0)) || ((dVar15 < 0.0 && (0.0 < dVar17)))) &&
             (((double)cv_mem->cv_rootdir[uVar9] * dVar17 <= 0.0 &&
              (dVar15 = ABS(dVar15 / (dVar15 - dVar17)), dVar13 < dVar15)))) {
            uVar10 = uVar9 & 0xffffffff;
            bVar11 = true;
            dVar13 = dVar15;
          }
        }
        else if ((double)cv_mem->cv_rootdir[uVar9] * cv_mem->cv_glo[uVar9] <= 0.0) {
          bVar2 = true;
        }
      }
    }
    if (bVar11) {
      sVar14 = cv_mem->cv_tlo;
      dVar13 = cv_mem->cv_thi;
      dVar17 = 1.0;
      dVar15 = 0.5;
      iVar4 = 0;
      iVar3 = -1;
      while( true ) {
        iVar8 = iVar4;
        dVar16 = dVar13 - sVar14;
        if (ABS(dVar16) <= dVar12) goto LAB_0010ef11;
        if (iVar3 == iVar8) {
          dVar17 = dVar17 * dVar15;
        }
        else {
          dVar17 = 1.0;
        }
        t = dVar13 - (dVar16 * cv_mem->cv_ghi[(int)uVar10]) /
                     (cv_mem->cv_ghi[(int)uVar10] - cv_mem->cv_glo[(int)uVar10] * dVar17);
        dVar15 = ABS(dVar16) / dVar12;
        if (ABS(t - sVar14) < dVar12 * 0.5) {
          t = (double)(-(ulong)(5.0 < dVar15) & 0x3fb999999999999a |
                      ~-(ulong)(5.0 < dVar15) & (ulong)(0.5 / dVar15)) * dVar16 + sVar14;
        }
        if (ABS(dVar13 - t) < dVar12 * 0.5) {
          t = (double)(-(ulong)(5.0 < dVar15) & 0xbfb999999999999a |
                      ~-(ulong)(5.0 < dVar15) & (ulong)(-0.5 / dVar15)) * dVar16 + dVar13;
        }
        CVodeGetDky(cv_mem,t,0,cv_mem->cv_y);
        iVar4 = (*cv_mem->cv_gfun)(t,cv_mem->cv_y,cv_mem->cv_grout,cv_mem->cv_user_data);
        cv_mem->cv_nge = cv_mem->cv_nge + 1;
        if (iVar4 != 0) {
          return -0xc;
        }
        uVar5 = cv_mem->cv_nrtfn;
        uVar9 = 0;
        uVar6 = 0;
        if (0 < (int)uVar5) {
          uVar6 = (ulong)uVar5;
        }
        dVar12 = 0.0;
        bVar2 = false;
        bVar11 = false;
        for (; iVar4 = 1, uVar6 != uVar9; uVar9 = uVar9 + 1) {
          if (cv_mem->cv_gactive[uVar9] != 0) {
            dVar13 = cv_mem->cv_grout[uVar9];
            if ((dVar13 != 0.0) || (NAN(dVar13))) {
              dVar15 = cv_mem->cv_glo[uVar9];
              if ((((0.0 < dVar13) && (dVar15 < 0.0)) || ((dVar13 < 0.0 && (0.0 < dVar15)))) &&
                 (((double)cv_mem->cv_rootdir[uVar9] * dVar15 <= 0.0 &&
                  (dVar13 = ABS(dVar13 / (dVar13 - dVar15)), dVar12 < dVar13)))) {
                uVar10 = uVar9 & 0xffffffff;
                bVar11 = true;
                dVar12 = dVar13;
              }
            }
            else if ((double)cv_mem->cv_rootdir[uVar9] * cv_mem->cv_glo[uVar9] <= 0.0) {
              bVar2 = true;
            }
          }
        }
        if (!bVar11) break;
        cv_mem->cv_thi = t;
        for (uVar9 = 0; uVar6 != uVar9; uVar9 = uVar9 + 1) {
          cv_mem->cv_ghi[uVar9] = cv_mem->cv_grout[uVar9];
        }
        sVar14 = cv_mem->cv_tlo;
        dVar13 = cv_mem->cv_thi;
        dVar12 = cv_mem->cv_ttol;
        bVar11 = dVar12 < ABS(dVar13 - sVar14);
        dVar15 = 0.5;
LAB_0010ee07:
        iVar3 = iVar8;
        if (!bVar11) goto LAB_0010ef11;
      }
      if (!bVar2) {
        cv_mem->cv_tlo = t;
        for (uVar9 = 0; uVar6 != uVar9; uVar9 = uVar9 + 1) {
          cv_mem->cv_glo[uVar9] = cv_mem->cv_grout[uVar9];
        }
        sVar14 = cv_mem->cv_tlo;
        dVar13 = cv_mem->cv_thi;
        dVar12 = cv_mem->cv_ttol;
        bVar11 = dVar12 < ABS(dVar13 - sVar14);
        dVar15 = 2.0;
        iVar4 = 2;
        goto LAB_0010ee07;
      }
      cv_mem->cv_thi = t;
      uVar6 = 0;
      uVar9 = 0;
      if (0 < (int)uVar5) {
        uVar9 = (ulong)uVar5;
      }
      for (; uVar9 != uVar6; uVar6 = uVar6 + 1) {
        cv_mem->cv_ghi[uVar6] = cv_mem->cv_grout[uVar6];
      }
      dVar13 = cv_mem->cv_thi;
LAB_0010ef11:
      cv_mem->cv_trout = dVar13;
      for (lVar7 = 0; lVar7 < (int)uVar5; lVar7 = lVar7 + 1) {
        dVar12 = cv_mem->cv_ghi[lVar7];
        cv_mem->cv_grout[lVar7] = dVar12;
        piVar1 = cv_mem->cv_iroots;
        piVar1[lVar7] = 0;
        if (cv_mem->cv_gactive[lVar7] != 0) {
          if ((dVar12 != 0.0) || (NAN(dVar12))) {
            dVar13 = cv_mem->cv_glo[lVar7];
          }
          else {
            dVar13 = cv_mem->cv_glo[lVar7];
            if ((double)cv_mem->cv_rootdir[lVar7] * dVar13 <= 0.0) {
              piVar1[lVar7] = (uint)(dVar13 <= 0.0) * 2 + -1;
            }
          }
          if ((((0.0 < dVar12) && (dVar13 < 0.0)) || ((dVar12 < 0.0 && (0.0 < dVar13)))) &&
             ((double)cv_mem->cv_rootdir[lVar7] * dVar13 <= 0.0)) {
            piVar1[lVar7] = (uint)(dVar13 <= 0.0) * 2 + -1;
          }
        }
        uVar5 = cv_mem->cv_nrtfn;
      }
      goto LAB_0010eff2;
    }
    cv_mem->cv_trout = cv_mem->cv_thi;
    for (uVar9 = 0; uVar6 != uVar9; uVar9 = uVar9 + 1) {
      cv_mem->cv_grout[uVar9] = cv_mem->cv_ghi[uVar9];
    }
    if (bVar2) {
      for (lVar7 = 0; lVar7 < (int)uVar5; lVar7 = lVar7 + 1) {
        piVar1 = cv_mem->cv_iroots;
        piVar1[lVar7] = 0;
        if ((((cv_mem->cv_gactive[lVar7] != 0) && (cv_mem->cv_ghi[lVar7] == 0.0)) &&
            (!NAN(cv_mem->cv_ghi[lVar7]))) &&
           ((double)cv_mem->cv_rootdir[lVar7] * cv_mem->cv_glo[lVar7] <= 0.0)) {
          piVar1[lVar7] = (uint)(cv_mem->cv_glo[lVar7] <= 0.0) * 2 + -1;
        }
        uVar5 = cv_mem->cv_nrtfn;
      }
LAB_0010eff2:
      bVar11 = false;
    }
    else {
      bVar11 = true;
    }
    for (lVar7 = 0; lVar7 < (int)uVar5; lVar7 = lVar7 + 1) {
      if ((cv_mem->cv_gactive[lVar7] == 0) &&
         ((cv_mem->cv_grout[lVar7] != 0.0 || (NAN(cv_mem->cv_grout[lVar7]))))) {
        cv_mem->cv_gactive[lVar7] = 1;
        uVar5 = cv_mem->cv_nrtfn;
      }
    }
    cv_mem->cv_tlo = cv_mem->cv_trout;
    uVar9 = 0;
    uVar6 = (ulong)uVar5;
    if ((int)uVar5 < 1) {
      uVar6 = uVar9;
    }
    for (; uVar6 != uVar9; uVar9 = uVar9 + 1) {
      cv_mem->cv_glo[uVar9] = cv_mem->cv_grout[uVar9];
    }
    iVar4 = 0;
    if (!bVar11) {
      CVodeGetDky(cv_mem,cv_mem->cv_trout,0,cv_mem->cv_y);
      iVar4 = 1;
    }
  }
  return iVar4;
}

Assistant:

static int cvRcheck3(CVodeMem cv_mem)
{
  int i, ier, retval;

  /* Set thi = tn or tout, whichever comes first; set y = y(thi). */
  if (cv_mem->cv_taskc == CV_ONE_STEP)
  {
    cv_mem->cv_thi = cv_mem->cv_tn;
    N_VScale(ONE, cv_mem->cv_zn[0], cv_mem->cv_y);
  }
  if (cv_mem->cv_taskc == CV_NORMAL)
  {
    if ((cv_mem->cv_toutc - cv_mem->cv_tn) * cv_mem->cv_h >= ZERO)
    {
      cv_mem->cv_thi = cv_mem->cv_tn;
      N_VScale(ONE, cv_mem->cv_zn[0], cv_mem->cv_y);
    }
    else
    {
      cv_mem->cv_thi = cv_mem->cv_toutc;
      (void)CVodeGetDky(cv_mem, cv_mem->cv_thi, 0, cv_mem->cv_y);
    }
  }

  /* Set ghi = g(thi) and call cvRootfind to search (tlo,thi) for roots. */
  retval = cv_mem->cv_gfun(cv_mem->cv_thi, cv_mem->cv_y, cv_mem->cv_ghi,
                           cv_mem->cv_user_data);
  cv_mem->cv_nge++;
  if (retval != 0) { return (CV_RTFUNC_FAIL); }

  cv_mem->cv_ttol = (SUNRabs(cv_mem->cv_tn) + SUNRabs(cv_mem->cv_h)) *
                    cv_mem->cv_uround * HUNDRED;
  ier = cvRootfind(cv_mem);
  if (ier == CV_RTFUNC_FAIL) { return (CV_RTFUNC_FAIL); }
  for (i = 0; i < cv_mem->cv_nrtfn; i++)
  {
    if (!cv_mem->cv_gactive[i] && cv_mem->cv_grout[i] != ZERO)
    {
      cv_mem->cv_gactive[i] = SUNTRUE;
    }
  }
  cv_mem->cv_tlo = cv_mem->cv_trout;
  for (i = 0; i < cv_mem->cv_nrtfn; i++)
  {
    cv_mem->cv_glo[i] = cv_mem->cv_grout[i];
  }

  /* If no root found, return CV_SUCCESS. */
  if (ier == CV_SUCCESS) { return (CV_SUCCESS); }

  /* If a root was found, interpolate to get y(trout) and return.  */
  (void)CVodeGetDky(cv_mem, cv_mem->cv_trout, 0, cv_mem->cv_y);
  return (RTFOUND);
}